

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMLSParserImpl.cpp
# Opt level: O2

void __thiscall xercesc_4_0::DOMLSParserImpl::parseWithContext(DOMLSParserImpl *this)

{
  ActionType in_ECX;
  DOMNode *in_RDX;
  DOMLSInput *in_RSI;
  
  parseWithContext((DOMLSParserImpl *)&this[-1].super_AbstractDOMParser.fDocumentVector,in_RSI,
                   in_RDX,in_ECX);
  return;
}

Assistant:

DOMNode* DOMLSParserImpl::parseWithContext(const DOMLSInput* source,
                                           DOMNode* contextNode,
                                           const ActionType action)
{
    if (getParseInProgress())
        throw DOMException(DOMException::INVALID_STATE_ERR, XMLDOMMsg::LSParser_ParseInProgress, fMemoryManager);

    // remove the abort filter, if present
    if(fFilter==&g_AbortFilter)
        fFilter=0;
    if(fFilterAction)
        fFilterAction->removeAll();
    if(fFilterDelayedTextNodes)
        fFilterDelayedTextNodes->removeAll();

    DOMDocumentFragment* holder = contextNode->getOwnerDocument()->createDocumentFragment();
    // When parsing the input stream, the context node (or its parent, depending on where
    // the result will be inserted) is used for resolving unbound namespace prefixes
    if(action==ACTION_INSERT_BEFORE || action==ACTION_INSERT_AFTER || action==ACTION_REPLACE)
        fWrapNodesContext = contextNode->getParentNode();
    else
        fWrapNodesContext = contextNode;
    fWrapNodesInDocumentFragment = holder;
    fWrapNodesAction = action;
    // When calling parseWithContext, the values of the following configuration parameters
    // will be ignored and their default values will always be used instead: "validate",
    // "validate-if-schema", and "element-content-whitespace".
    ValSchemes oldValidate = getValidationScheme();
    setValidationScheme(Val_Never);
    bool oldElementContentWhitespace = getIncludeIgnorableWhitespace();
    setIncludeIgnorableWhitespace(true);

    Wrapper4DOMLSInput isWrapper((DOMLSInput*)source, fEntityResolver, false, getMemoryManager());
    AbstractDOMParser::parse(isWrapper);

    setValidationScheme(oldValidate);
    setIncludeIgnorableWhitespace(oldElementContentWhitespace);
    fWrapNodesContext = NULL;
    fWrapNodesInDocumentFragment = NULL;
    fDocument = NULL;

    if(getErrorCount()!=0)
    {
        holder->release();
        throw DOMLSException(DOMLSException::PARSE_ERR, XMLDOMMsg::LSParser_ParsingFailed, fMemoryManager);
    }

    DOMNode* result = holder->getFirstChild();
    DOMNode* node, *parent = contextNode->getParentNode();
    switch(action)
    {
    case ACTION_REPLACE_CHILDREN:
        // remove existing children
        while((node = contextNode->getFirstChild())!=NULL)
            contextNode->removeChild(node)->release();
        // then fall back to behave like an append
    case ACTION_APPEND_AS_CHILDREN:
        while((node = holder->getFirstChild())!=NULL)
            contextNode->appendChild(holder->removeChild(node));
        break;
    case ACTION_INSERT_BEFORE:
        while((node = holder->getFirstChild())!=NULL)
            parent->insertBefore(holder->removeChild(node), contextNode);
        break;
    case ACTION_INSERT_AFTER:
        while((node = holder->getLastChild())!=NULL)
            parent->insertBefore(holder->removeChild(node), contextNode->getNextSibling());
        break;
    case ACTION_REPLACE:
        while((node = holder->getFirstChild())!=NULL)
            parent->insertBefore(holder->removeChild(node), contextNode);
        parent->removeChild(contextNode)->release();
        break;
    }
    holder->release();

    // TODO whenever we add support for DOM Mutation Events:
    //   As the new data is inserted into the document, at least one mutation event is fired
    //   per new immediate child or sibling of the context node.
    return result;
}